

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::NetworkAddress,_std::nullptr_t> __thiscall
kj::anon_unknown_0::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  LowLevelAsyncIoProvider *params;
  bool bVar1;
  SocketAddress *this_00;
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress,_std::nullptr_t> OVar2;
  Array<kj::(anonymous_namespace)::SocketAddress> local_110;
  undefined1 local_f8 [24];
  Fault f;
  DebugExpression<bool> _kjCondition;
  SocketAddress local_d0;
  undefined1 local_48 [8];
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  uint len_local;
  void *sockaddr_local;
  SocketNetwork *this_local;
  
  array.disposer._4_4_ = in_ECX;
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,1);
  SocketAddress::SocketAddress
            (&local_d0,(void *)CONCAT44(in_register_00000014,len),array.disposer._4_4_);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::
  add<kj::(anonymous_namespace)::SocketAddress>
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,&local_d0);
  this_00 = ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::operator[]
                      ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48,0);
  f.exception._2_1_ = SocketAddress::allowedBy(this_00,(NetworkFilter *)((long)sockaddr + 0x10));
  f.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 3))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              ((Fault *)(local_f8 + 0x10),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x6d5,FAILED,"array[0].allowedBy(filter)",
               "_kjCondition,\"address blocked by restrictPeers()\"",
               (DebugExpression<bool> *)((long)&f.exception + 3),
               (char (*) [35])"address blocked by restrictPeers()");
    kj::_::Debug::Fault::~Fault((Fault *)(local_f8 + 0x10));
  }
  params = *(LowLevelAsyncIoProvider **)((long)sockaddr + 8);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::finish
            (&local_110,(ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  heap<kj::(anonymous_namespace)::NetworkAddressImpl,kj::LowLevelAsyncIoProvider&,kj::_::NetworkFilter&,kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((kj *)local_f8,params,(NetworkFilter *)((long)sockaddr + 0x10),&local_110);
  Own<kj::NetworkAddress,decltype(nullptr)>::Own<kj::(anonymous_namespace)::NetworkAddressImpl,void>
            ((Own<kj::NetworkAddress,decltype(nullptr)> *)this,
             (Own<kj::(anonymous_namespace)::NetworkAddressImpl,_std::nullptr_t> *)local_f8);
  Own<kj::(anonymous_namespace)::NetworkAddressImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressImpl,_std::nullptr_t> *)local_f8);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&local_110);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder
            ((ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }